

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-filepath.cc
# Opt level: O0

char * __thiscall testing::internal::FilePath::FindLastPathSeparator(FilePath *this)

{
  char *pcVar1;
  char *last_sep;
  FilePath *this_local;
  
  pcVar1 = c_str(this);
  pcVar1 = strrchr(pcVar1,0x2f);
  return pcVar1;
}

Assistant:

const char* FilePath::FindLastPathSeparator() const {
  const char* const last_sep = strrchr(c_str(), kPathSeparator);
#if GTEST_HAS_ALT_PATH_SEP_
  const char* const last_alt_sep = strrchr(c_str(), kAlternatePathSeparator);
  // Comparing two pointers of which only one is NULL is undefined.
  if (last_alt_sep != nullptr &&
      (last_sep == nullptr || last_alt_sep > last_sep)) {
    return last_alt_sep;
  }
#endif
  return last_sep;
}